

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-test.h
# Opt level: O0

ValueArray<std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>_>
* testing::
  Values<std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>,std::tuple<unsigned_int,unsigned_int,char_const*>>
            (tuple<unsigned_int,_unsigned_int,_const_char_*> *v,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_1,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_2,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_3,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_4,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_5,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_6,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_7,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_8,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_9,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_10,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_11,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_12,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_13,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_14,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_15,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_16,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_17,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_18,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_19,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_20,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_21,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_22,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_23,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_24,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_25,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_26,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_27,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_28,
            tuple<unsigned_int,_unsigned_int,_const_char_*> *v_29)

{
  ValueArray<std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>_>
  *in_RDI;
  tuple<unsigned_int,_unsigned_int,_const_char_*> *in_stack_00000070;
  tuple<unsigned_int,_unsigned_int,_const_char_*> *in_stack_00000078;
  tuple<unsigned_int,_unsigned_int,_const_char_*> *in_stack_00000080;
  tuple<unsigned_int,_unsigned_int,_const_char_*> *in_stack_00000088;
  tuple<unsigned_int,_unsigned_int,_const_char_*> *in_stack_00000090;
  ValueArray<std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>_>
  *in_stack_00000098;
  tuple<unsigned_int,_unsigned_int,_const_char_*> *in_stack_fffffffffffffb78;
  tuple<unsigned_int,_unsigned_int,_const_char_*> *in_stack_fffffffffffffb80;
  _Head_base<2UL,_const_char_*,_false> in_stack_fffffffffffffdc0;
  tuple<unsigned_int,_unsigned_int,_const_char_*> *in_stack_fffffffffffffdc8;
  tuple<unsigned_int,_unsigned_int,_const_char_*> *in_stack_fffffffffffffdd0;
  tuple<unsigned_int,_unsigned_int,_const_char_*> *in_stack_fffffffffffffdd8;
  tuple<unsigned_int,_unsigned_int,_const_char_*> *in_stack_fffffffffffffde0;
  tuple<unsigned_int,_unsigned_int,_const_char_*> *in_stack_fffffffffffffde8;
  tuple<unsigned_int,_unsigned_int,_const_char_*> *in_stack_fffffffffffffdf0;
  tuple<unsigned_int,_unsigned_int,_const_char_*> local_1b0;
  tuple<unsigned_int,_unsigned_int,_const_char_*> local_1a0;
  tuple<unsigned_int,_unsigned_int,_const_char_*> local_190;
  tuple<unsigned_int,_unsigned_int,_const_char_*> local_180;
  tuple<unsigned_int,_unsigned_int,_const_char_*> local_170;
  tuple<unsigned_int,_unsigned_int,_const_char_*> local_160;
  tuple<unsigned_int,_unsigned_int,_const_char_*> local_150;
  tuple<unsigned_int,_unsigned_int,_const_char_*> local_140;
  tuple<unsigned_int,_unsigned_int,_const_char_*> local_130;
  tuple<unsigned_int,_unsigned_int,_const_char_*> local_120;
  tuple<unsigned_int,_unsigned_int,_const_char_*> local_110;
  tuple<unsigned_int,_unsigned_int,_const_char_*> local_100;
  tuple<unsigned_int,_unsigned_int,_const_char_*> local_f0;
  tuple<unsigned_int,_unsigned_int,_const_char_*> local_e0;
  tuple<unsigned_int,_unsigned_int,_const_char_*> local_d0;
  tuple<unsigned_int,_unsigned_int,_const_char_*> local_c0 [9];
  
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  std::tuple<unsigned_int,_unsigned_int,_const_char_*>::tuple
            (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  internal::
  ValueArray<std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>,_std::tuple<unsigned_int,_unsigned_int,_const_char_*>_>
  ::ValueArray(in_stack_00000098,in_stack_00000090,in_stack_00000088,in_stack_00000080,
               in_stack_00000078,in_stack_00000070,local_c0,&local_d0,&local_e0,&local_f0,&local_100
               ,&local_110,&local_120,&local_130,&local_140,&local_150,&local_160,&local_170,
               &local_180,&local_190,&local_1a0,&local_1b0,
               (tuple<unsigned_int,_unsigned_int,_const_char_*> *)&stack0xfffffffffffffdc0,
               (tuple<unsigned_int,_unsigned_int,_const_char_*> *)in_RDI,
               (tuple<unsigned_int,_unsigned_int,_const_char_*> *)
               in_stack_fffffffffffffdc0._M_head_impl,in_stack_fffffffffffffdc8,
               in_stack_fffffffffffffdd0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffde0,
               in_stack_fffffffffffffde8,in_stack_fffffffffffffdf0);
  return in_RDI;
}

Assistant:

internal::ValueArray<T...> Values(T... v) {
  return internal::ValueArray<T...>(std::move(v)...);
}